

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::ReadEntireFile_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,FILE *file)

{
  ulong uVar1;
  void *pvVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = 0;
  fseek((FILE *)this,0,2);
  uVar1 = ftell((FILE *)this);
  pvVar2 = operator_new__(uVar1);
  fseek((FILE *)this,0,0);
  do {
    sVar3 = fread((void *)((long)pvVar2 + uVar4),1,uVar1 - uVar4,(FILE *)this);
    uVar4 = uVar4 + sVar3;
    if (sVar3 == 0) break;
  } while (uVar4 < uVar1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pvVar2,(long)pvVar2 + uVar4);
  operator_delete__(pvVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadEntireFile(FILE* file) {
  const size_t file_size = GetFileSize(file);
  char* const buffer = new char[file_size];

  size_t bytes_last_read = 0;  // # of bytes read in the last fread()
  size_t bytes_read = 0;       // # of bytes read so far

  fseek(file, 0, SEEK_SET);

  // Keeps reading the file until we cannot read further or the
  // pre-determined file size is reached.
  do {
    bytes_last_read = fread(buffer+bytes_read, 1, file_size-bytes_read, file);
    bytes_read += bytes_last_read;
  } while (bytes_last_read > 0 && bytes_read < file_size);

  const std::string content(buffer, bytes_read);
  delete[] buffer;

  return content;
}